

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheVk.cpp
# Opt level: O2

void __thiscall
Diligent::ShaderResourceCacheVk::InitializeResources
          (ShaderResourceCacheVk *this,Uint32 Set,Uint32 Offset,Uint32 ArraySize,DescriptorType Type
          ,bool HasImmutableSampler)

{
  DescriptorSet *this_00;
  Resource *this_01;
  ulong uVar1;
  size_type __n;
  bool bVar2;
  reference rVar3;
  
  this_00 = GetDescriptorSet(this,Set);
  __n = (size_type)Offset;
  uVar1 = (ulong)ArraySize;
  while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
    this_01 = DescriptorSet::GetResource(this_00,(Uint32)__n);
    Resource::Resource(this_01,Type,HasImmutableSampler);
    rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((this->m_DbgInitializedResources).
                       super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + Set,__n);
    *rVar3._M_p = *rVar3._M_p | rVar3._M_mask;
    __n = __n + 1;
  }
  return;
}

Assistant:

void ShaderResourceCacheVk::InitializeResources(Uint32 Set, Uint32 Offset, Uint32 ArraySize, DescriptorType Type, bool HasImmutableSampler)
{
    DescriptorSet& DescrSet = GetDescriptorSet(Set);
    for (Uint32 res = 0; res < ArraySize; ++res)
    {
        new (&DescrSet.GetResource(Offset + res)) Resource{Type, HasImmutableSampler};
#ifdef DILIGENT_DEBUG
        m_DbgInitializedResources[Set][size_t{Offset} + res] = true;
#endif
    }
}